

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

size_t absl::numbers_internal::SixDigitsToBuffer(double d,Nonnull<char_*> buffer)

{
  undefined4 uVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  char *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  ExpDigits EVar6;
  double in_stack_00000020;
  int dig1;
  char *digits;
  int exp;
  ExpDigits exp_dig;
  char *out;
  int local_44;
  int local_30;
  char cStack_2c;
  char cStack_2a;
  byte bStack_28;
  byte bStack_27;
  byte *local_20;
  double local_10;
  byte *local_8;
  
  uVar4 = std::isnan(in_XMM0_Qa);
  if ((uVar4 & 1) == 0) {
    local_20 = (byte *)in_RDI;
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      local_10 = in_XMM0_Qa;
      if (in_XMM0_Qa < 0.0) {
        local_20 = (byte *)(in_RDI + 1);
        *in_RDI = '-';
        local_10 = -in_XMM0_Qa;
      }
      dVar5 = std::numeric_limits<double>::max();
      if (local_10 <= dVar5) {
        EVar6 = SplitToSix(in_stack_00000020);
        bStack_28 = EVar6.digits[4];
        bStack_27 = EVar6.digits[5];
        cStack_2c = EVar6.digits[0];
        cStack_2a = EVar6.digits[2];
        local_30 = EVar6.exponent;
        local_44 = local_30;
        *local_20 = '0';
        local_20[1] = '.';
        uVar1 = EVar6.digits._0_4_;
        switch((Nonnull<char_*>)(ulong)(local_30 + 4)) {
        case (Nonnull<char_*>)0x0:
          local_20[2] = '0';
          local_20 = local_20 + 1;
        case (Nonnull<char_*>)0x1:
          local_20[2] = '0';
          local_20 = local_20 + 1;
        case (Nonnull<char_*>)0x2:
          local_20[2] = '0';
          local_20 = local_20 + 1;
        case (Nonnull<char_*>)0x3:
          *(undefined4 *)(local_20 + 2) = uVar1;
          *(short *)(local_20 + 6) = EVar6.digits._4_2_;
          for (local_20 = local_20 + 8; local_20[-1] == '0'; local_20 = local_20 + -1) {
          }
          *local_20 = '\0';
          local_8 = local_20 + -(long)in_RDI;
          break;
        case (Nonnull<char_*>)0x4:
          *local_20 = cStack_2c;
          local_20[1] = '.';
          *(int *)(local_20 + 2) = EVar6.digits._1_4_;
          local_20[6] = bStack_27;
          for (local_20 = local_20 + 7; local_20[-1] == '0'; local_20 = local_20 + -1) {
          }
          if (local_20[-1] == '.') {
            local_20 = local_20 + -1;
          }
          *local_20 = '\0';
          local_8 = local_20 + -(long)in_RDI;
          break;
        case (Nonnull<char_*>)0x5:
          *(short *)local_20 = EVar6.digits._0_2_;
          local_20[2] = '.';
          *(int *)(local_20 + 3) = EVar6.digits._2_4_;
          for (local_20 = local_20 + 7; local_20[-1] == '0'; local_20 = local_20 + -1) {
          }
          if (local_20[-1] == '.') {
            local_20 = local_20 + -1;
          }
          *local_20 = '\0';
          local_8 = local_20 + -(long)in_RDI;
          break;
        case (Nonnull<char_*>)0x6:
          *(short *)local_20 = EVar6.digits._0_2_;
          local_20[2] = cStack_2a;
          local_20[3] = '.';
          *(short *)(local_20 + 4) = EVar6.digits._3_2_;
          local_20[6] = bStack_27;
          for (local_20 = local_20 + 7; local_20[-1] == '0'; local_20 = local_20 + -1) {
          }
          if (local_20[-1] == '.') {
            local_20 = local_20 + -1;
          }
          *local_20 = '\0';
          local_8 = local_20 + -(long)in_RDI;
          break;
        case (Nonnull<char_*>)0x7:
          *(undefined4 *)local_20 = uVar1;
          pbVar2 = local_20 + 4;
          if ((bStack_27 | bStack_28) != 0x30) {
            local_20[4] = 0x2e;
            local_20[5] = bStack_28;
            pbVar2 = local_20 + 6;
            if (bStack_27 != 0x30) {
              local_20[6] = bStack_27;
              pbVar2 = local_20 + 7;
            }
          }
          local_20 = pbVar2;
          *local_20 = 0;
          local_8 = local_20 + -(long)in_RDI;
          break;
        case (Nonnull<char_*>)0x8:
          *(undefined4 *)local_20 = uVar1;
          local_20[4] = bStack_28;
          pbVar2 = local_20 + 5;
          if (bStack_27 != 0x30) {
            local_20[5] = '.';
            local_20[6] = bStack_27;
            pbVar2 = local_20 + 7;
          }
          local_20 = pbVar2;
          *local_20 = '\0';
          local_8 = local_20 + -(long)in_RDI;
          break;
        case (Nonnull<char_*>)0x9:
          *(undefined4 *)local_20 = uVar1;
          *(short *)(local_20 + 4) = EVar6.digits._4_2_;
          local_20[6] = '\0';
          local_8 = local_20 + 6 + -(long)in_RDI;
          break;
        default:
          if (-5 < local_30 && local_30 < 6) {
            __assert_fail("exp < -4 || exp >= 6",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                          ,0x288,
                          "size_t absl::numbers_internal::SixDigitsToBuffer(double, const absl::Nonnull<char *>)"
                         );
          }
          *local_20 = cStack_2c;
          if (local_20[1] != '.') {
            __assert_fail("out[1] == \'.\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                          ,0x28a,
                          "size_t absl::numbers_internal::SixDigitsToBuffer(double, const absl::Nonnull<char *>)"
                         );
          }
          *(int *)(local_20 + 2) = EVar6.digits._1_4_;
          local_20[6] = bStack_27;
          for (local_20 = local_20 + 7; local_20[-1] == '0'; local_20 = local_20 + -1) {
          }
          if (local_20[-1] == '.') {
            local_20 = local_20 + -1;
          }
          pbVar2 = local_20;
          *local_20 = 'e';
          if (local_30 < 1) {
            local_20[1] = '-';
            local_44 = -local_30;
          }
          else {
            local_20[1] = '+';
          }
          local_20 = local_20 + 2;
          if (99 < local_44) {
            *local_20 = (char)(local_44 / 100) + '0';
            local_20 = pbVar2 + 3;
          }
          PutTwoDigits((uint32_t)((ulong)local_10 >> 0x20),(Nonnull<char_*>)(ulong)(local_30 + 4));
          local_20[2] = '\0';
          local_8 = local_20 + 2 + -(long)in_RDI;
        }
      }
      else {
        strcpy((char *)local_20,"inf");
        local_8 = local_20 + (3 - (long)in_RDI);
      }
    }
    else {
      bVar3 = std::signbit(in_XMM0_Qa);
      if (bVar3) {
        local_20 = (byte *)(in_RDI + 1);
        *in_RDI = '-';
      }
      *local_20 = '0';
      local_20[1] = '\0';
      local_8 = local_20 + 1 + -(long)in_RDI;
    }
  }
  else {
    strcpy(in_RDI,"nan");
    local_8 = (byte *)0x3;
  }
  return (size_t)local_8;
}

Assistant:

size_t numbers_internal::SixDigitsToBuffer(double d,
                                           absl::Nonnull<char*> const buffer) {
  static_assert(std::numeric_limits<float>::is_iec559,
                "IEEE-754/IEC-559 support only");

  char* out = buffer;  // we write data to out, incrementing as we go, but
                       // FloatToBuffer always returns the address of the buffer
                       // passed in.

  if (std::isnan(d)) {
    strcpy(out, "nan");  // NOLINT(runtime/printf)
    return 3;
  }
  if (d == 0) {  // +0 and -0 are handled here
    if (std::signbit(d)) *out++ = '-';
    *out++ = '0';
    *out = 0;
    return static_cast<size_t>(out - buffer);
  }
  if (d < 0) {
    *out++ = '-';
    d = -d;
  }
  if (d > std::numeric_limits<double>::max()) {
    strcpy(out, "inf");  // NOLINT(runtime/printf)
    return static_cast<size_t>(out + 3 - buffer);
  }

  auto exp_dig = SplitToSix(d);
  int exp = exp_dig.exponent;
  const char* digits = exp_dig.digits;
  out[0] = '0';
  out[1] = '.';
  switch (exp) {
    case 5:
      memcpy(out, &digits[0], 6), out += 6;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 4:
      memcpy(out, &digits[0], 5), out += 5;
      if (digits[5] != '0') {
        *out++ = '.';
        *out++ = digits[5];
      }
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 3:
      memcpy(out, &digits[0], 4), out += 4;
      if ((digits[5] | digits[4]) != '0') {
        *out++ = '.';
        *out++ = digits[4];
        if (digits[5] != '0') *out++ = digits[5];
      }
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 2:
      memcpy(out, &digits[0], 3), out += 3;
      *out++ = '.';
      memcpy(out, &digits[3], 3);
      out += 3;
      while (out[-1] == '0') --out;
      if (out[-1] == '.') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 1:
      memcpy(out, &digits[0], 2), out += 2;
      *out++ = '.';
      memcpy(out, &digits[2], 4);
      out += 4;
      while (out[-1] == '0') --out;
      if (out[-1] == '.') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 0:
      memcpy(out, &digits[0], 1), out += 1;
      *out++ = '.';
      memcpy(out, &digits[1], 5);
      out += 5;
      while (out[-1] == '0') --out;
      if (out[-1] == '.') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case -4:
      out[2] = '0';
      ++out;
      ABSL_FALLTHROUGH_INTENDED;
    case -3:
      out[2] = '0';
      ++out;
      ABSL_FALLTHROUGH_INTENDED;
    case -2:
      out[2] = '0';
      ++out;
      ABSL_FALLTHROUGH_INTENDED;
    case -1:
      out += 2;
      memcpy(out, &digits[0], 6);
      out += 6;
      while (out[-1] == '0') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
  }
  assert(exp < -4 || exp >= 6);
  out[0] = digits[0];
  assert(out[1] == '.');
  out += 2;
  memcpy(out, &digits[1], 5), out += 5;
  while (out[-1] == '0') --out;
  if (out[-1] == '.') --out;
  *out++ = 'e';
  if (exp > 0) {
    *out++ = '+';
  } else {
    *out++ = '-';
    exp = -exp;
  }
  if (exp > 99) {
    int dig1 = exp / 100;
    exp -= dig1 * 100;
    *out++ = '0' + static_cast<char>(dig1);
  }
  PutTwoDigits(static_cast<uint32_t>(exp), out);
  out += 2;
  *out = 0;
  return static_cast<size_t>(out - buffer);
}